

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O1

aiNode * __thiscall
Assimp::ObjFileImporter::createNodes
          (ObjFileImporter *this,Model *pModel,Object *pObject,aiNode *pParent,aiScene *pScene,
          vector<aiMesh_*,_std::allocator<aiMesh_*>_> *MeshArray)

{
  pointer *pppaVar1;
  long lVar2;
  uint uVar3;
  iterator __position;
  pointer ppOVar4;
  pointer ppOVar5;
  ulong uVar6;
  aiNode *this_00;
  pointer puVar7;
  aiMesh *this_01;
  aiNode **ppaVar8;
  uint *puVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  aiMesh *pMesh;
  aiMesh *local_38;
  
  if (pModel == (Model *)0x0) {
    __assert_fail("__null != pModel",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                  ,0x104,
                  "aiNode *Assimp::ObjFileImporter::createNodes(const ObjFile::Model *, const ObjFile::Object *, aiNode *, aiScene *, std::vector<aiMesh *> &)"
                 );
  }
  if (pObject == (Object *)0x0) {
    this_00 = (aiNode *)0x0;
  }
  else {
    uVar6 = (long)(MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    uVar12 = (pObject->m_strObjName)._M_string_length;
    if (uVar12 < 0x400) {
      (this_00->mName).length = (ai_uint32)uVar12;
      memcpy((this_00->mName).data,(pObject->m_strObjName)._M_dataplus._M_p,uVar12);
      (this_00->mName).data[uVar12] = '\0';
    }
    if (pParent == (aiNode *)0x0) {
      __assert_fail("__null != pParent",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                    ,0x110,
                    "aiNode *Assimp::ObjFileImporter::createNodes(const ObjFile::Model *, const ObjFile::Object *, aiNode *, aiScene *, std::vector<aiMesh *> &)"
                   );
    }
    this_00->mParent = pParent;
    uVar3 = pParent->mNumChildren;
    pParent->mNumChildren = uVar3 + 1;
    pParent->mChildren[uVar3] = this_00;
    puVar7 = (pObject->m_Meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pObject->m_Meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar7) {
      uVar12 = 0;
      do {
        this_01 = createTopology(this,pModel,pObject,puVar7[uVar12]);
        local_38 = this_01;
        if (this_01 != (aiMesh *)0x0) {
          if (this_01->mNumFaces == 0) {
            aiMesh::~aiMesh(this_01);
            operator_delete(this_01,0x520);
          }
          else {
            __position._M_current =
                 (MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                        ((vector<aiMesh*,std::allocator<aiMesh*>> *)MeshArray,__position,&local_38);
            }
            else {
              *__position._M_current = this_01;
              pppaVar1 = &(MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              *pppaVar1 = *pppaVar1 + 1;
            }
          }
        }
        uVar12 = uVar12 + 1;
        puVar7 = (pObject->m_Meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar12 < (ulong)((long)(pObject->m_Meshes).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 2
                               ));
    }
    lVar13 = (long)uVar6 >> 3;
    ppOVar4 = (pObject->m_SubObjects).
              super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppOVar5 = (pObject->m_SubObjects).
              super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppOVar4 != ppOVar5) {
      uVar12 = (long)ppOVar5 - (long)ppOVar4;
      uVar11 = (long)uVar12 >> 3;
      this_00->mNumChildren = (uint)uVar11;
      ppaVar8 = (aiNode **)operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | uVar12);
      this_00->mChildren = ppaVar8;
      this_00->mNumMeshes = 1;
      puVar9 = (uint *)operator_new__(4);
      this_00->mMeshes = puVar9;
    }
    uVar12 = ((long)(MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) - lVar13;
    if (uVar12 != 0) {
      puVar9 = (uint *)operator_new__(-(ulong)(uVar12 >> 0x3e != 0) | uVar12 * 4);
      this_00->mMeshes = puVar9;
      this_00->mNumMeshes = (uint)uVar12;
      if (uVar6 < (ulong)((long)(MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                               _M_impl.super__Vector_impl_data._M_start)) {
        lVar10 = 0;
        do {
          this_00->mMeshes[lVar10] = pScene->mNumMeshes;
          pScene->mNumMeshes = pScene->mNumMeshes + 1;
          lVar2 = lVar13 + lVar10;
          lVar10 = lVar10 + 1;
        } while (lVar2 + 1U <
                 (ulong)((long)(MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
  }
  return this_00;
}

Assistant:

aiNode *ObjFileImporter::createNodes(const ObjFile::Model* pModel, const ObjFile::Object* pObject,
                                     aiNode *pParent, aiScene* pScene,
                                     std::vector<aiMesh*> &MeshArray )
{
    ai_assert( NULL != pModel );
    if( NULL == pObject ) {
        return NULL;
    }

    // Store older mesh size to be able to computes mesh offsets for new mesh instances
    const size_t oldMeshSize = MeshArray.size();
    aiNode *pNode = new aiNode;

    pNode->mName = pObject->m_strObjName;

    // If we have a parent node, store it
    ai_assert( NULL != pParent );
    appendChildToParentNode( pParent, pNode );

    for ( size_t i=0; i< pObject->m_Meshes.size(); ++i ) {
        unsigned int meshId = pObject->m_Meshes[ i ];
        aiMesh *pMesh = createTopology( pModel, pObject, meshId );
        if( pMesh ) {
            if (pMesh->mNumFaces > 0) {
                MeshArray.push_back( pMesh );
            } else {
                delete pMesh;
            }
        }
    }

    // Create all nodes from the sub-objects stored in the current object
    if ( !pObject->m_SubObjects.empty() ) {
        size_t numChilds = pObject->m_SubObjects.size();
        pNode->mNumChildren = static_cast<unsigned int>( numChilds );
        pNode->mChildren = new aiNode*[ numChilds ];
        pNode->mNumMeshes = 1;
        pNode->mMeshes = new unsigned int[ 1 ];
    }

    // Set mesh instances into scene- and node-instances
    const size_t meshSizeDiff = MeshArray.size()- oldMeshSize;
    if ( meshSizeDiff > 0 ) {
        pNode->mMeshes = new unsigned int[ meshSizeDiff ];
        pNode->mNumMeshes = static_cast<unsigned int>( meshSizeDiff );
        size_t index = 0;
        for (size_t i = oldMeshSize; i < MeshArray.size(); ++i ) {
            pNode->mMeshes[ index ] = pScene->mNumMeshes;
            pScene->mNumMeshes++;
            ++index;
        }
    }

    return pNode;
}